

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile-time-zero-delay-observer.hxx
# Opt level: O0

void __thiscall
stateObservation::compileTime::ZeroDelayObserver<4U,_3U,_0U>::setState
          (ZeroDelayObserver<4U,_3U,_0U> *this,StateVector *x_k,uint k)

{
  bool bVar1;
  size_type sVar2;
  reference this_00;
  uint *puVar3;
  uint k_local;
  StateVector *x_k_local;
  ZeroDelayObserver<4U,_3U,_0U> *this_local;
  
  IndexedMatrix<4U,_1U>::set(&this->x_,x_k,k);
  while( true ) {
    sVar2 = std::
            deque<stateObservation::compileTime::IndexedMatrix<3U,_1U>,_Eigen::aligned_allocator<stateObservation::compileTime::IndexedMatrix<3U,_1U>_>_>
            ::size(&this->y_);
    bVar1 = false;
    if (sVar2 != 0) {
      this_00 = std::
                deque<stateObservation::compileTime::IndexedMatrix<3U,_1U>,_Eigen::aligned_allocator<stateObservation::compileTime::IndexedMatrix<3U,_1U>_>_>
                ::operator[](&this->y_,0);
      puVar3 = IndexedMatrix<3U,_1U>::getTime(this_00);
      bVar1 = *puVar3 <= k;
    }
    if (!bVar1) break;
    std::
    deque<stateObservation::compileTime::IndexedMatrix<3U,_1U>,_Eigen::aligned_allocator<stateObservation::compileTime::IndexedMatrix<3U,_1U>_>_>
    ::pop_front(&this->y_);
  }
  return;
}

Assistant:

void ZeroDelayObserver<n,m,p>::setState
(const typename ObserverBase<n,m,p>::StateVector& x_k,unsigned k)
{
    x_.set(x_k,k);
    while (y_.size()>0 && y_[0].getTime()<=k)
    {
        y_.pop_front();
    }

    if (p>0)
        while (u_.size()>0 && u_[0].getTime()<k)
        {
            u_.pop_front();
        }
}